

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O1

void length_update_prices(lzma_length_encoder *lc,uint32_t pos_state)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar5 = lc->table_size;
  lc->counters[pos_state] = uVar5;
  uVar10 = (ulong)(lc->choice >> 4);
  bVar1 = lzma_rc_prices[uVar10 ^ 0x7f];
  uVar7 = (ulong)(lc->choice2 >> 4);
  bVar2 = lzma_rc_prices[uVar7];
  bVar3 = lzma_rc_prices[uVar7 ^ 0x7f];
  if ((ulong)uVar5 == 0) {
    uVar7 = 0;
  }
  else {
    bVar4 = lzma_rc_prices[uVar10];
    uVar10 = 8;
    if (uVar5 < 8) {
      uVar10 = (ulong)uVar5;
    }
    uVar7 = 0;
    do {
      iVar6 = 0;
      uVar8 = (uint)uVar7 | 8;
      do {
        uVar9 = uVar8 >> 1;
        iVar6 = iVar6 + (uint)lzma_rc_prices
                              [(-(uVar8 & 1) & 0x7f0 ^
                               (uint)*(ushort *)
                                      ((long)lc->low[pos_state] + (ulong)(uVar8 & 0xfffffffe))) >> 4
                              ];
        uVar8 = uVar9;
      } while (uVar9 != 1);
      lc->prices[pos_state][uVar7] = iVar6 + (uint)bVar4;
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar10);
  }
  uVar8 = 0x10;
  if (uVar5 < 0x10) {
    uVar8 = uVar5;
  }
  if ((uint)uVar7 < uVar8) {
    uVar7 = uVar7 & 0xffffffff;
    do {
      iVar6 = 0;
      uVar10 = uVar7 & 0xffffffff;
      do {
        uVar9 = (uint)uVar10;
        uVar10 = uVar10 >> 1;
        iVar6 = iVar6 + (uint)lzma_rc_prices
                              [(-(uVar9 & 1) & 0x7f0 ^
                               (uint)*(ushort *)
                                      ((long)lc->mid[pos_state] + (ulong)(uVar9 & 0xfffffffe))) >> 4
                              ];
      } while ((int)uVar10 != 1);
      lc->prices[pos_state][uVar7] = iVar6 + (uint)bVar2 + (uint)bVar1;
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar8);
  }
  if ((uint)uVar7 < uVar5) {
    uVar7 = uVar7 & 0xffffffff;
    do {
      iVar6 = 0;
      uVar8 = (int)uVar7 + 0xf0;
      do {
        uVar9 = uVar8 >> 1;
        iVar6 = iVar6 + (uint)lzma_rc_prices
                              [(-(uVar8 & 1) & 0x7f0 ^
                               (uint)*(ushort *)((long)lc->high + (ulong)(uVar8 & 0xfffffffe))) >> 4
                              ];
        uVar8 = uVar9;
      } while (uVar9 != 1);
      lc->prices[pos_state][uVar7] = iVar6 + (uint)bVar3 + (uint)bVar1;
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar5);
  }
  return;
}

Assistant:

static void
length_update_prices(lzma_length_encoder *lc, const uint32_t pos_state)
{
	uint32_t a0, a1, b0, b1;
	uint32_t *prices;
	uint32_t i;

	const uint32_t table_size = lc->table_size;
	lc->counters[pos_state] = table_size;

	a0 = rc_bit_0_price(lc->choice);
	a1 = rc_bit_1_price(lc->choice);
	b0 = a1 + rc_bit_0_price(lc->choice2);
	b1 = a1 + rc_bit_1_price(lc->choice2);
	prices = lc->prices[pos_state];

	for (i = 0; i < table_size && i < LEN_LOW_SYMBOLS; ++i)
		prices[i] = a0 + rc_bittree_price(lc->low[pos_state],
				LEN_LOW_BITS, i);

	for (; i < table_size && i < LEN_LOW_SYMBOLS + LEN_MID_SYMBOLS; ++i)
		prices[i] = b0 + rc_bittree_price(lc->mid[pos_state],
				LEN_MID_BITS, i - LEN_LOW_SYMBOLS);

	for (; i < table_size; ++i)
		prices[i] = b1 + rc_bittree_price(lc->high, LEN_HIGH_BITS,
				i - LEN_LOW_SYMBOLS - LEN_MID_SYMBOLS);

	return;
}